

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.c
# Opt level: O3

int map_get(pMap map,size_t key,void *value)

{
  ulong uVar1;
  long lVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  
  uVar1 = map->count;
  iVar3 = -1;
  if (uVar1 != 0) {
    if (*map->keys == key) {
      uVar4 = 0;
      iVar3 = 0;
    }
    else {
      uVar5 = 0;
      do {
        if (uVar1 - 1 == uVar5) {
          return -1;
        }
        uVar4 = uVar5 + 1;
        lVar2 = uVar5 + 1;
        uVar5 = uVar4;
      } while (map->keys[lVar2] != key);
      iVar3 = (uVar4 < uVar1) - 1;
    }
    memcpy(value,(void *)(uVar4 * map->value_size + (long)map->values),map->value_size);
  }
  return iVar3;
}

Assistant:

int map_get(pMap map, size_t key, void *value)
{
    for (int i = 0; i < map->count; i++)
    {
        if (map->keys[i] == key)
        {
            memcpy(value, map->values + i * map->value_size, map->value_size);
            return MAP_SUCCESS;
        }
    }
    return MAP_FAILED;
}